

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEditPrivate::cursorPositionChanged(QTextEditPrivate *this)

{
  QTextEdit *this_00;
  long in_FS_OFFSET;
  undefined1 auStack_48 [8];
  code *local_40;
  undefined1 *local_38;
  QTextEdit *local_30;
  undefined4 local_28;
  undefined4 local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextEdit **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  QTextEdit::cursorPositionChanged(this_00);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QTextEdit::textCursor((QTextEdit *)auStack_48);
  local_24 = QTextCursor::position();
  local_28 = 0xffffffff;
  local_40 = QTextCursor::isNull;
  local_38 = (undefined1 *)CONCAT44(local_38._4_4_,0x11b);
  local_30 = this_00;
  QTextCursor::~QTextCursor((QTextCursor *)auStack_48);
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_40);
  QAccessibleTextCursorEvent::~QAccessibleTextCursorEvent((QAccessibleTextCursorEvent *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEditPrivate::cursorPositionChanged()
{
    Q_Q(QTextEdit);
    emit q->cursorPositionChanged();
#if QT_CONFIG(accessibility)
    QAccessibleTextCursorEvent event(q, q->textCursor().position());
    QAccessible::updateAccessibility(&event);
#endif
}